

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.c
# Opt level: O1

uint8_t reverse_byte(uint8_t b)

{
  byte bVar1;
  
  bVar1 = b << 4 | b >> 4;
  bVar1 = (bVar1 & 0x33) << 2 | bVar1 >> 2 & 0x33;
  return bVar1 >> 1 & 0x55 | (bVar1 & 0x55) * '\x02';
}

Assistant:

uint8_t reverse_byte(uint8_t b) {
    return (b & 0x80) >> 7 | (b & 0x40) >> 5 | (b & 0x20) >> 3 |
           (b & 0x10) >> 1 | (b & 0x08) << 1 | (b & 0x04) << 3 |
           (b & 0x02) << 5 | (b & 0x01) << 7;
}